

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BufferMapInvalidateCase::iterate(BufferMapInvalidateCase *this)

{
  RenderContext *renderCtx;
  deUint32 seed;
  int iVar1;
  deUint32 buffer;
  GLenum GVar2;
  deBool dVar3;
  uint uVar4;
  char *pcVar5;
  TestLog *log;
  deUint8 *pdVar6;
  void *pvVar7;
  TestError *this_00;
  bool isOk;
  void *ptr;
  int verifySize;
  int verifyOffset;
  int mapWriteOffs;
  int mapSize;
  int mapOffset;
  int bufferSize;
  BufferVerifier local_38;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  deUint32 buf;
  deUint32 dataSeed;
  BufferMapInvalidateCase *this_local;
  
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar5);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)&verifier);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier(&local_38,renderCtx,log,this->m_verify);
  iVar1 = 0;
  if ((this->m_partialWrite & 1U) != 0) {
    iVar1 = 0x5b;
  }
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)&verifier,0x514);
  pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar6,0x514,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  GVar2 = this->m_bufferTarget;
  pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,GVar2,0x514,pdVar6,this->m_usage);
  pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                     ((ReferenceBuffer *)&verifier,iVar1 + 200);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar6,0x3f3 - iVar1,seed & 0xabcdef);
  pvVar7 = glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,200,0x3f3,
                      10);
  GVar2 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar2,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0xf9);
  while( true ) {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (pvVar7 == (void *)0x0)) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                         ((ReferenceBuffer *)&verifier,iVar1 + 200);
      ::deMemcpy((void *)((long)pvVar7 + (long)iVar1),pdVar6,(long)(0x3f3 - iVar1));
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget);
      GVar2 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar2,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0xfe);
      pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
      uVar4 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                        (&local_38,(EVP_PKEY_CTX *)(ulong)buffer,pdVar6,(ulong)(iVar1 + 200),
                         (uchar *)(ulong)(0x3f3 - iVar1),(ulong)this->m_bufferTarget);
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
      pcVar5 = "Buffer verification failed";
      if ((uVar4 & 1) != 0) {
        pcVar5 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~((byte)uVar4 & 1) & QP_TEST_RESULT_FAIL,pcVar5);
      deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_38);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)&verifier);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0xfa);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed		= deStringHash(getName());
		deUint32		buf				= 0;
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier		(m_renderCtx, m_testCtx.getLog(), m_verify);
		const int		bufferSize		= 1300;
		const int		mapOffset		= 200;
		const int		mapSize			= 1011;
		const int		mapWriteOffs	= m_partialWrite ? 91 : 0;
		const int		verifyOffset	= mapOffset+mapWriteOffs;
		const int		verifySize		= mapSize-mapWriteOffs;

		// Setup reference data.
		refBuf.setSize(bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), bufferSize, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, bufferSize, refBuf.getPtr(), m_usage);

		// Do reference map.
		fillWithRandomBytes(refBuf.getPtr(mapOffset+mapWriteOffs), mapSize-mapWriteOffs, dataSeed&0xabcdef);

		void* ptr = glMapBufferRange(m_bufferTarget, mapOffset, mapSize, GL_MAP_WRITE_BIT|GL_MAP_INVALIDATE_BUFFER_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		deMemcpy((deUint8*)ptr+mapWriteOffs, refBuf.getPtr(mapOffset+mapWriteOffs), mapSize-mapWriteOffs);
		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		bool isOk = verifier.verify(buf, refBuf.getPtr(), verifyOffset, verifySize, m_bufferTarget);
		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}